

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateModule(ExpressionEvalContext *ctx,ExprModule *expression)

{
  StackVariable *__s;
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *this;
  Allocator *pAVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  ExprBase *pEVar6;
  StackFrame *pSVar4;
  
  iVar2 = (*ctx->ctx->allocator->_vptr_Allocator[2])();
  pSVar4 = (StackFrame *)CONCAT44(extraout_var,iVar2);
  pAVar1 = ctx->ctx->allocator;
  pSVar4->owner = (FunctionData *)0x0;
  __s = (pSVar4->variables).little;
  memset(__s,0,0x200);
  (pSVar4->variables).allocator = pAVar1;
  (pSVar4->variables).data = __s;
  (pSVar4->variables).count = 0;
  (pSVar4->variables).max = 0x20;
  pSVar4->returnValue = (ExprBase *)0x0;
  pSVar4->targetYield = 0;
  pSVar4->breakDepth = 0;
  pSVar4->continueDepth = 0;
  ctx->globalFrame = pSVar4;
  this = &ctx->stackFrames;
  uVar3 = (ctx->stackFrames).count;
  if (uVar3 == (ctx->stackFrames).max) {
    SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::grow(this,uVar3);
  }
  if (this->data == (StackFrame **)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,
                  "void SmallArray<ExpressionEvalContext::StackFrame *, 32>::push_back(const T &) [T = ExpressionEvalContext::StackFrame *, N = 32]"
                 );
  }
  pSVar4 = ctx->globalFrame;
  uVar3 = (ctx->stackFrames).count;
  (ctx->stackFrames).count = uVar3 + 1;
  this->data[uVar3] = pSVar4;
  if (uVar3 + 1 == 0) {
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x172,
                  "T &SmallArray<ExpressionEvalContext::StackFrame *, 32>::back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                 );
  }
  pSVar4 = this->data[uVar3];
  for (pEVar6 = (expression->setup).head; pEVar6 != (ExprBase *)0x0; pEVar6 = pEVar6->next) {
    pEVar5 = Evaluate(ctx,pEVar6);
    if (pEVar5 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
  }
  for (pEVar6 = (expression->expressions).head; pEVar6 != (ExprBase *)0x0; pEVar6 = pEVar6->next) {
    pEVar5 = Evaluate(ctx,pEVar6);
    if (pEVar5 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    if ((pSVar4->breakDepth != 0) || (pSVar4->continueDepth != 0)) {
      __assert_fail("frame->breakDepth == 0 && frame->continueDepth == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0xc53,"ExprBase *EvaluateModule(ExpressionEvalContext &, ExprModule *)");
    }
    if (pSVar4->returnValue != (ExprBase *)0x0) {
      return pSVar4->returnValue;
    }
  }
  uVar3 = (ctx->stackFrames).count;
  if (uVar3 == 0) {
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x183,
                  "void SmallArray<ExpressionEvalContext::StackFrame *, 32>::pop_back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                 );
  }
  uVar3 = uVar3 - 1;
  (ctx->stackFrames).count = uVar3;
  if (uVar3 == 0) {
    return (ExprBase *)0x0;
  }
  __assert_fail("ctx.stackFrames.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                ,0xc5b,"ExprBase *EvaluateModule(ExpressionEvalContext &, ExprModule *)");
}

Assistant:

ExprBase* EvaluateModule(ExpressionEvalContext &ctx, ExprModule *expression)
{
	ctx.globalFrame = new (ctx.ctx.get<ExpressionEvalContext::StackFrame>()) ExpressionEvalContext::StackFrame(ctx.ctx.allocator, NULL);
	ctx.stackFrames.push_back(ctx.globalFrame);

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	for(ExprBase *value = expression->setup.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;
	}

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;

		assert(frame->breakDepth == 0 && frame->continueDepth == 0);

		if(frame->returnValue)
			return frame->returnValue;
	}

	ctx.stackFrames.pop_back();

	assert(ctx.stackFrames.empty());

	return NULL;
}